

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::HighBDConvolveScaleTest_DISABLED_Speed_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::HighBDConvolveScaleTest_DISABLED_Speed_Test>
           *this)

{
  HighBDConvolveScaleTest *this_00;
  
  WithParamInterface<std::tuple<void(*)(unsigned_short_const*,int,unsigned_short*,int,int,int,InterpFilterParams_const*,InterpFilterParams_const*,int,int,int,int,ConvolveParams*,int),std::tuple<int,int>,int>>
  ::parameter_ = &this->parameter_;
  this_00 = (HighBDConvolveScaleTest *)operator_new(0x80);
  anon_unknown.dwarf_1ef7149::HighBDConvolveScaleTest::HighBDConvolveScaleTest(this_00);
  (this_00->super_ConvolveScaleTestBase<unsigned_short>).super_Test._vptr_Test =
       (_func_int **)&PTR__HighBDConvolveScaleTest_00f70210;
  (this_00->
  super_WithParamInterface<std::tuple<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*,_int),_std::tuple<int,_int>,_int>_>
  )._vptr_WithParamInterface =
       (_func_int **)&PTR__HighBDConvolveScaleTest_DISABLED_Speed_Test_00f70258;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }